

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterCase::getNumAtomicCounterBuffers
          (AtomicCounterCase *this)

{
  bool bVar1;
  DataType dataType;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar2;
  const_reference ppSVar3;
  DefaultBlock *pDVar4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  int local_44;
  undefined1 local_40 [4];
  int ndx;
  set<int,_std::less<int>,_std::allocator<int>_> buffers;
  AtomicCounterCase *this_local;
  
  buffers._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  local_44 = 0;
  while( true ) {
    pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
    ppSVar3 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](pvVar2,0);
    pDVar4 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar3);
    sVar5 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                      (&pDVar4->variables);
    if ((int)sVar5 <= local_44) break;
    pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
    ppSVar3 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](pvVar2,0);
    pDVar4 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar3);
    pvVar6 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](&pDVar4->variables,(long)local_44);
    bVar1 = glu::VarType::isBasicType(&pvVar6->varType);
    if (bVar1) {
      pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
      ppSVar3 = std::
                vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ::operator[](pvVar2,0);
      pDVar4 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar3);
      pvVar6 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
               operator[](&pDVar4->variables,(long)local_44);
      dataType = glu::VarType::getBasicType(&pvVar6->varType);
      bVar1 = glu::isDataTypeAtomicCounter(dataType);
      if (bVar1) {
        pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
        ppSVar3 = std::
                  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                  ::operator[](pvVar2,0);
        pDVar4 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar3);
        pvVar6 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                 operator[](&pDVar4->variables,(long)local_44);
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40,
                   &(pvVar6->layout).binding);
      }
    }
    local_44 = local_44 + 1;
  }
  sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  return (int)sVar7;
}

Assistant:

int AtomicCounterCase::getNumAtomicCounterBuffers (void) const
{
	std::set<int> buffers;

	for (int ndx = 0; ndx < (int)m_program->getShaders()[0]->getDefaultBlock().variables.size(); ++ndx)
	{
		if (m_program->getShaders()[0]->getDefaultBlock().variables[ndx].varType.isBasicType() &&
			glu::isDataTypeAtomicCounter(m_program->getShaders()[0]->getDefaultBlock().variables[ndx].varType.getBasicType()))
		{
			buffers.insert(m_program->getShaders()[0]->getDefaultBlock().variables[ndx].layout.binding);
		}
	}

	return (int)buffers.size();
}